

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O0

void ON_ProgressReporter::ReportProgress
               (ON_ProgressReporter *progress_reporter,double fraction_complete)

{
  double local_28;
  double max_callback_count;
  double fraction_complete_local;
  ON_ProgressReporter *progress_reporter_local;
  
  if ((progress_reporter != (ON_ProgressReporter *)0x0) &&
     ((progress_reporter->m_fraction_complete <= fraction_complete &&
       fraction_complete != progress_reporter->m_fraction_complete ||
      (progress_reporter->m_previous_callback_fraction_complete <= -1.0)))) {
    if (progress_reporter->m_fraction_complete <= fraction_complete &&
        fraction_complete != progress_reporter->m_fraction_complete) {
      local_28 = fraction_complete;
      if (1.0 <= fraction_complete) {
        local_28 = 1.0;
      }
      progress_reporter->m_fraction_complete = local_28;
    }
    if ((progress_reporter->m_callback_function != (_func_void_ON__UINT_PTR_double *)0x0) &&
       ((progress_reporter->m_previous_callback_fraction_complete + 0.0009765625 <=
         progress_reporter->m_fraction_complete ||
        (((progress_reporter->m_fraction_complete == 1.0 &&
          (!NAN(progress_reporter->m_fraction_complete))) &&
         (progress_reporter->m_previous_callback_fraction_complete <= 1.0 &&
          progress_reporter->m_previous_callback_fraction_complete != 1.0)))))) {
      (*progress_reporter->m_callback_function)
                (progress_reporter->m_callback_context,progress_reporter->m_fraction_complete);
      progress_reporter->m_previous_callback_fraction_complete =
           progress_reporter->m_fraction_complete;
    }
  }
  return;
}

Assistant:

void ON_ProgressReporter::ReportProgress( 
  ON_ProgressReporter* progress_reporter,
  double fraction_complete
  )
{
  if ( 0 != progress_reporter )
  {
    if (    fraction_complete > progress_reporter->m_fraction_complete 
         || progress_reporter->m_previous_callback_fraction_complete <= -1.0 
       )
    {
      if ( fraction_complete > progress_reporter->m_fraction_complete )
      {
        progress_reporter->m_fraction_complete = (fraction_complete < 1.0) ? fraction_complete : 1.0;
      }

      if ( 0 != progress_reporter->m_callback_function )
      {
        // callback at most 1026 times
        const double max_callback_count = 1024.0;
        if (    (progress_reporter->m_fraction_complete >= progress_reporter->m_previous_callback_fraction_complete + 1.0/max_callback_count )
             || (1.0 == progress_reporter->m_fraction_complete && progress_reporter->m_previous_callback_fraction_complete < 1.0)
           )
        {
          progress_reporter->m_callback_function(progress_reporter->m_callback_context,progress_reporter->m_fraction_complete);
          progress_reporter->m_previous_callback_fraction_complete = progress_reporter->m_fraction_complete;
        }
      }
    }
  }
}